

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O0

void add_format_to_iofile
               (FMContext fmc,FMFormat_conflict format,int id_size,void *id_buffer,int index)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  FMContext p_Var6;
  void *in_RCX;
  int in_EDX;
  FMContext in_RSI;
  long in_RDI;
  int in_R8D;
  bool bVar7;
  FMFormat_conflict subformat_1;
  FMFormat_conflict subformat;
  FMFormat_conflict iof;
  int j;
  int field;
  int i;
  int subformat_count;
  uchar *in_stack_000000a0;
  int in_stack_0000091c;
  FMFormat_conflict in_stack_00000920;
  FMContext in_stack_ffffffffffffffb0;
  int local_34;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar8;
  int local_28;
  int local_24;
  undefined4 in_stack_ffffffffffffffe8;
  
  local_28 = 0;
  iVar5 = get_format_server_verbose();
  if (iVar5 != 0) {
    uVar1._0_4_ = in_RSI->native_float_format;
    uVar1._4_4_ = in_RSI->native_column_major_arrays;
    printf("Entering format %s (%p) into context %p ",uVar1,in_RSI,in_RDI);
    print_server_ID(in_stack_000000a0);
  }
  while( true ) {
    lVar3._0_4_ = in_RSI[1].byte_reversal;
    lVar3._4_4_ = in_RSI[1].native_pointer_size;
    bVar7 = false;
    if (lVar3 != 0) {
      bVar7 = *(long *)(*(long *)&in_RSI[1].byte_reversal + (long)local_28 * 8) != 0;
    }
    if (!bVar7) break;
    *(undefined8 *)(*(long *)(*(long *)&in_RSI[1].byte_reversal + (long)local_28 * 8) + 0x70) =
         *(undefined8 *)&in_RSI[1].byte_reversal;
    local_28 = local_28 + 1;
  }
  if (in_EDX != 0) {
    *(int *)&in_RSI->result = in_EDX;
    p_Var6 = (FMContext)ffs_malloc((size_t)in_stack_ffffffffffffffb0);
    in_RSI->master_context = p_Var6;
    memcpy(in_RSI->master_context,in_RCX,(long)in_EDX);
  }
  fill_derived_format_values(in_RSI,(FMFormat_conflict)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  for (iVar5 = 0; iVar5 < local_28; iVar5 = iVar5 + 1) {
    fill_derived_format_values(in_RSI,(FMFormat_conflict)CONCAT44(in_EDX,in_stack_ffffffffffffffe8))
    ;
  }
  if (*(int *)(in_RDI + 4) == *(int *)(in_RDI + 0x58)) {
    expand_FMContext(in_stack_ffffffffffffffb0);
  }
  if (in_R8D == -1) {
    local_24 = *(int *)(in_RDI + 4);
    *(int *)(in_RDI + 4) = local_24 + 1;
  }
  else {
    if (*(long *)(*(long *)(in_RDI + 0x60) + (long)in_R8D * 8) != 0) {
      free_FMformat((FMFormat_conflict)CONCAT44(iVar5,in_stack_ffffffffffffffd0));
    }
    if (*(int *)(in_RDI + 4) < in_R8D) {
      uVar2._0_4_ = in_RSI->native_float_format;
      uVar2._4_4_ = in_RSI->native_column_major_arrays;
      printf("Internal error. skipped format ids format %s.\n",uVar2);
      return;
    }
    local_24 = in_R8D;
    if (in_R8D == *(int *)(in_RDI + 4)) {
      *(int *)(in_RDI + 4) = *(int *)(in_RDI + 4) + 1;
    }
  }
  *(FMContext *)(*(long *)(in_RDI + 0x60) + (long)local_24 * 8) = in_RSI;
  in_RSI->errno_val = local_24;
  topo_order_subformats(in_stack_00000920,in_stack_0000091c);
  for (iVar5 = 0; iVar5 < local_28; iVar5 = iVar5 + 1) {
    for (local_34 = 0; local_34 < local_28; local_34 = local_34 + 1) {
      lVar3 = *(long *)(*(long *)&in_RSI[1].byte_reversal + (long)local_34 * 8);
      for (iVar8 = 0; iVar8 < *(int *)(lVar3 + 0x44); iVar8 = iVar8 + 1) {
        lVar4 = *(long *)(*(long *)(lVar3 + 0x88) + (long)iVar8 * 8);
        if (lVar4 != 0) {
          *(uint *)(lVar3 + 0x48) = *(uint *)(lVar4 + 0x48) | *(uint *)(lVar3 + 0x48);
        }
      }
    }
  }
  for (iVar5 = 0; iVar5 < *(int *)((long)&in_RSI->server_fd + 4); iVar5 = iVar5 + 1) {
    if (*(long *)(in_RSI[1].result + (long)iVar5 * 8) != 0) {
      in_RSI->server_pid =
           *(uint *)(*(long *)(in_RSI[1].result + (long)iVar5 * 8) + 0x48) | in_RSI->server_pid;
    }
  }
  return;
}

Assistant:

extern void
add_format_to_iofile(FMContext fmc, FMFormat format, int id_size,
		     void *id_buffer, int index)
{
    int subformat_count = 0;
    int i, field;

    if (get_format_server_verbose()) {
	printf("Entering format %s (%p) into context %p ", 
	       format->format_name, format,
	       fmc);
	print_server_ID(id_buffer);
    }
    while (format->subformats && format->subformats[subformat_count]) {
	format->subformats[subformat_count]->subformats = format->subformats;
	subformat_count++;
    }
    if (id_size) {
	format->server_ID.length = id_size;
	format->server_ID.value = malloc(id_size);
	memcpy(format->server_ID.value, id_buffer, id_size);
    }

    fill_derived_format_values(fmc, format);
    for (i=0; i < subformat_count; i++) {
	fill_derived_format_values(fmc, format->subformats[i]);
    }	
    if (fmc->reg_format_count == fmc->format_list_size) {
	expand_FMContext(fmc);
    }
    if (index == -1) {
	index = fmc->reg_format_count++;
    } else {
 	if (fmc->format_list[index] != NULL) {
  	    free_FMformat(fmc->format_list[index]);
  	}
  	if (index > fmc->reg_format_count) {
  	    printf("Internal error. skipped format ids format %s.\n", 
		   format->format_name);
	    return;
  	}
  	if (index == fmc->reg_format_count) {
 	    /* new format came in */
  	    fmc->reg_format_count++;
  	}
    }
    fmc->format_list[index] = format;
    format->format_index = index;
    topo_order_subformats(format, subformat_count);
    /* bubble up the variant flags */
    for (i= 0; i < subformat_count; i++) {
	int j;
	for (j= 0; j < subformat_count; j++) {
	    FMFormat iof = format->subformats[j];
	    for (field = 0; field < iof->field_count; field++) {
		FMFormat subformat = iof->field_subformats[field];
		if (subformat != NULL) {
		    iof->variant |= subformat->variant;
		}
	    }
	}
    }
    for (field = 0; field < format->field_count; field++) {
	FMFormat subformat = format->field_subformats[field];
	if (subformat != NULL) {
	    format->variant |= subformat->variant;
	}
    }
}